

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCases.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::Texture2DRenderCase::Texture2DRenderCase
          (Texture2DRenderCase *this,Context *context,char *name,char *description,deUint32 format,
          deUint32 dataType,deUint32 wrapS,deUint32 wrapT,deUint32 minFilter,deUint32 magFilter,
          Mat3 *coordTransform,int numTextures,bool powerOfTwo)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  bool powerOfTwo_local;
  deUint32 dataType_local;
  deUint32 format_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  Texture2DRenderCase *this_local;
  
  testCtx = gles2::Context::getTestContext(context);
  renderCtx = gles2::Context::getRenderContext(context);
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (&this->super_ShaderPerformanceCase,testCtx,renderCtx,name,description,CASETYPE_FRAGMENT
            );
  (this->super_ShaderPerformanceCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DRenderCase_03296560;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  tcu::Matrix<float,_3,_3>::Matrix(&this->m_coordTransform,coordTransform);
  this->m_numTextures = numTextures;
  this->m_powerOfTwo = powerOfTwo;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::vector(&this->m_textures);
  return;
}

Assistant:

Texture2DRenderCase::Texture2DRenderCase (Context&			context,
										  const char*		name,
										  const char*		description,
										  deUint32			format,
										  deUint32			dataType,
										  deUint32			wrapS,
										  deUint32			wrapT,
										  deUint32			minFilter,
										  deUint32			magFilter,
										  const tcu::Mat3&	coordTransform,
										  int				numTextures,
										  bool				powerOfTwo)
	: ShaderPerformanceCase	(context.getTestContext(), context.getRenderContext(), name, description, CASETYPE_FRAGMENT)
	, m_format				(format)
	, m_dataType			(dataType)
	, m_wrapS				(wrapS)
	, m_wrapT				(wrapT)
	, m_minFilter			(minFilter)
	, m_magFilter			(magFilter)
	, m_coordTransform		(coordTransform)
	, m_numTextures			(numTextures)
	, m_powerOfTwo			(powerOfTwo)
{
}